

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O1

void __thiscall avro::json::JsonGenerator::encodeString(JsonGenerator *this,string *s)

{
  State SVar1;
  uint8_t *puVar2;
  
  SVar1 = this->top;
  if (SVar1 == stKey) {
    this->top = stMapN;
  }
  else {
    if (SVar1 == stMapN) {
      if ((this->out_).next_ == (this->out_).end_) {
        StreamWriter::more(&this->out_);
      }
      puVar2 = (this->out_).next_;
      (this->out_).next_ = puVar2 + 1;
      *puVar2 = ',';
    }
    else if (SVar1 != stMap0) {
      sep(this);
      goto LAB_0019b4a3;
    }
    this->top = stKey;
  }
LAB_0019b4a3:
  doEncodeString(this,s);
  if (this->top == stKey) {
    if ((this->out_).next_ == (this->out_).end_) {
      StreamWriter::more(&this->out_);
    }
    puVar2 = (this->out_).next_;
    (this->out_).next_ = puVar2 + 1;
    *puVar2 = ':';
  }
  return;
}

Assistant:

void encodeString(const std::string& s) {
        if (top == stMap0) {
            top = stKey;
        } else if (top == stMapN) {
            out_.write(',');
            top = stKey;
        } else if (top == stKey) {
            top = stMapN;
        } else {
            sep();
        }
        doEncodeString(s);
        if (top == stKey) {
            out_.write(':');
        }
    }